

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall helics::apps::Player::sendInformation(Player *this,Time sendTime,int iteration)

{
  iterator *this_00;
  reference pPVar1;
  ulong uVar2;
  reference this_01;
  pointer pVVar3;
  pointer pMVar4;
  pointer pVVar5;
  void *__buf;
  ulong uVar6;
  int in_R8D;
  
  uVar2 = this->pointIndex;
  pVVar3 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (uVar2 < (ulong)((long)pVVar5 - (long)pVVar3 >> 7)) {
    this_00 = &(this->publications).
               super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
               super__Deque_impl_data._M_start;
    do {
      if (sendTime.internalTimeCode <= pVVar3[uVar2].time.internalTimeCode) {
        uVar6 = (long)pVVar5 - (long)pVVar3 >> 7;
        break;
      }
      pPVar1 = CLI::std::
               _Deque_iterator<helics::Publication,_helics::Publication_&,_helics::Publication_*>::
               operator[](this_00,(long)pVVar3[uVar2].index);
      Publication::publishDefV
                (pPVar1,&(this->points).
                         super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->pointIndex].value);
      uVar2 = this->pointIndex + 1;
      this->pointIndex = uVar2;
      pVVar3 = (this->points).
               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar5 = (this->points).
               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (long)pVVar5 - (long)pVVar3 >> 7;
    } while (uVar2 < uVar6);
    if (uVar2 < uVar6) {
      do {
        if ((pVVar3[uVar2].time.internalTimeCode != sendTime.internalTimeCode) ||
           (pVVar3[uVar2].iteration != iteration)) break;
        pPVar1 = CLI::std::
                 _Deque_iterator<helics::Publication,_helics::Publication_&,_helics::Publication_*>
                 ::operator[](this_00,(long)pVVar3[uVar2].index);
        Publication::publishDefV
                  (pPVar1,&(this->points).
                           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           ._M_impl.super__Vector_impl_data._M_start[this->pointIndex].value);
        uVar2 = this->pointIndex + 1;
        this->pointIndex = uVar2;
        pVVar3 = (this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar2 < (ulong)((long)(this->points).
                                     super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3 >> 7)
              );
    }
  }
  uVar2 = this->messageIndex;
  pMVar4 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)(((long)(this->messages).
                             super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x110)) {
    do {
      if (sendTime.internalTimeCode < pMVar4[uVar2].sendTime.internalTimeCode) {
        return;
      }
      this_01 = CLI::std::_Deque_iterator<helics::Endpoint,_helics::Endpoint_&,_helics::Endpoint_*>
                ::operator[](&(this->endpoints).
                              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
                              ._M_impl.super__Deque_impl_data._M_start,(long)pMVar4[uVar2].index);
      pMVar4 = (this->messages).
               super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __buf = (void *)(this->messageIndex * 0x110);
      Endpoint::send(this_01,(int)pMVar4 + (int)__buf + 0x10,__buf,(size_t)pMVar4,in_R8D);
      uVar2 = this->messageIndex + 1;
      this->messageIndex = uVar2;
      pMVar4 = (this->messages).
               super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)(((long)(this->messages).
                                    super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) /
                            0x110));
  }
  return;
}

Assistant:

void Player::sendInformation(Time sendTime, int iteration)
{
    if (isValidIndex(pointIndex, points)) {
        while (points[pointIndex].time < sendTime) {
            publications[points[pointIndex].index].publish(points[pointIndex].value);
            ++pointIndex;
            if (pointIndex >= points.size()) {
                break;
            }
        }
        if (isValidIndex(pointIndex, points)) {
            while ((points[pointIndex].time == sendTime) &&
                   (points[pointIndex].iteration == iteration)) {
                publications[points[pointIndex].index].publish(points[pointIndex].value);
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
    }
    if (isValidIndex(messageIndex, messages)) {
        while (messages[messageIndex].sendTime <= sendTime) {
            endpoints[messages[messageIndex].index].send(messages[messageIndex].mess);
            ++messageIndex;
            if (messageIndex >= messages.size()) {
                break;
            }
        }
    }
}